

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O2

float trainCNN(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
              vector<case_t,_std::allocator<case_t>_> *cases)

{
  pointer pcVar1;
  ostream *poVar2;
  uint uVar3;
  pointer train_tensor;
  float fVar4;
  float local_34;
  
  train_tensor = (cases->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  pcVar1 = (cases->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_34 = 0.0;
  uVar3 = 1;
  while( true ) {
    if (train_tensor == pcVar1) break;
    fVar4 = trainIterate(layers,&train_tensor->data,&train_tensor->out);
    local_34 = fVar4 + local_34;
    if ((uVar3 / 6000) * -6000 + 1 + uVar3 == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Case ");
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 5;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
      poVar2 = std::operator<<(poVar2,". Err=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34 / (float)(int)uVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar3 = uVar3 + 1;
    train_tensor = train_tensor + 1;
  }
  return local_34;
}

Assistant:

float trainCNN(std::vector<layer_t *> &layers, std::vector<case_t> &cases) {
  float total_error = 0.0f;
  // Iterate over all the test cases
  int count = 0;
  for (case_t &c : cases) {
    // Train the model with a new test case, and retreive the new error.
    float xerr = trainIterate(layers, c.data, c.out);
    // Accumulate the total error for all test cases.
    total_error += xerr;

    // Once every 6000 training iterations, report the total error.
    count++;
    if (count % 6000 == 0) {
      std::cout << "Case " << std::setw(5) << count << ". Err=" << total_error / count << std::endl;
    }
  }
  return total_error;
}